

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O2

AggregateFunctionSet * duckdb::MadFun::GetFunctions(void)

{
  vector<duckdb::AggregateFunction,_true> *this;
  AggregateFunctionSet *in_RDI;
  long lVar1;
  pointer type;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_381;
  vector<duckdb::LogicalType,_true> MAD_TYPES;
  LogicalType local_368;
  string local_350;
  LogicalType local_330 [4];
  LogicalType local_2d0;
  LogicalType local_2b8;
  LogicalType local_2a0;
  AggregateFunction local_288;
  AggregateFunction local_158;
  
  ::std::__cxx11::string::string((string *)&local_350,"mad",(allocator *)local_330);
  AggregateFunctionSet::AggregateFunctionSet(in_RDI,&local_350);
  ::std::__cxx11::string::~string((string *)&local_350);
  LogicalType::LogicalType((LogicalType *)&MAD_TYPES,DECIMAL);
  __l._M_len = 1;
  __l._M_array = (iterator)&MAD_TYPES;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_330,__l,
             &local_381);
  LogicalType::LogicalType(&local_368,DECIMAL);
  AggregateFunction::AggregateFunction
            (&local_288,(vector<duckdb::LogicalType,_true> *)local_330,&local_368,
             (aggregate_size_t)0x0,(aggregate_initialize_t)0x0,(aggregate_update_t)0x0,
             (aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,
             BindMedianAbsoluteDeviationDecimal,(aggregate_destructor_t)0x0,
             (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  this = &(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_288);
  AggregateFunction::~AggregateFunction(&local_288);
  LogicalType::~LogicalType(&local_368);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_330);
  LogicalType::~LogicalType((LogicalType *)&MAD_TYPES);
  LogicalType::LogicalType(local_330,FLOAT);
  LogicalType::LogicalType(local_330 + 1,DOUBLE);
  LogicalType::LogicalType(local_330 + 2,DATE);
  LogicalType::LogicalType(local_330 + 3,TIMESTAMP);
  LogicalType::LogicalType(&local_2d0,TIME);
  LogicalType::LogicalType(&local_2b8,TIMESTAMP_TZ);
  LogicalType::LogicalType(&local_2a0,TIME_TZ);
  __l_00._M_len = 7;
  __l_00._M_array = local_330;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&MAD_TYPES.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             __l_00,(allocator_type *)&local_368);
  lVar1 = 0x90;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_330[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  for (type = MAD_TYPES.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start;
      type != MAD_TYPES.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish; type = type + 1) {
    GetMedianAbsoluteDeviationAggregateFunction(&local_158,type);
    ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
    emplace_back<duckdb::AggregateFunction>
              (&this->
                super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
               &local_158);
    AggregateFunction::~AggregateFunction(&local_158);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&MAD_TYPES.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return in_RDI;
}

Assistant:

AggregateFunctionSet MadFun::GetFunctions() {
	AggregateFunctionSet mad("mad");
	mad.AddFunction(AggregateFunction({LogicalTypeId::DECIMAL}, LogicalTypeId::DECIMAL, nullptr, nullptr, nullptr,
	                                  nullptr, nullptr, nullptr, BindMedianAbsoluteDeviationDecimal));

	const vector<LogicalType> MAD_TYPES = {LogicalType::FLOAT,     LogicalType::DOUBLE, LogicalType::DATE,
	                                       LogicalType::TIMESTAMP, LogicalType::TIME,   LogicalType::TIMESTAMP_TZ,
	                                       LogicalType::TIME_TZ};
	for (const auto &type : MAD_TYPES) {
		mad.AddFunction(GetMedianAbsoluteDeviationAggregateFunction(type));
	}
	return mad;
}